

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_data_source_set_range_in_pcm_frames
                    (ma_data_source *pDataSource,ma_uint64 rangeBegInFrames,
                    ma_uint64 rangeEndInFrames)

{
  code *pcVar1;
  int iVar2;
  ulong in_RAX;
  ulong uVar3;
  ma_data_source_base *pDataSourceBase;
  ma_result mVar4;
  ulong local_28;
  
  mVar4 = MA_INVALID_ARGS;
  if (rangeBegInFrames <= rangeEndInFrames && pDataSource != (ma_data_source *)0x0) {
    if ((*(code **)(*pDataSource + 0x18) == (code *)0x0) ||
       (local_28 = in_RAX, iVar2 = (**(code **)(*pDataSource + 0x18))(pDataSource,&local_28),
       iVar2 != 0)) {
      *(ma_uint64 *)((long)pDataSource + 8) = rangeBegInFrames;
      *(ma_uint64 *)((long)pDataSource + 0x10) = rangeEndInFrames;
      *(undefined8 *)((long)pDataSource + 0x18) = 0;
      *(undefined8 *)((long)pDataSource + 0x20) = 0xffffffffffffffff;
      mVar4 = MA_SUCCESS;
    }
    else {
      uVar3 = *(ulong *)((long)pDataSource + 8);
      if (*(ulong *)((long)pDataSource + 8) < local_28) {
        uVar3 = local_28;
      }
      *(ma_uint64 *)((long)pDataSource + 8) = rangeBegInFrames;
      *(ma_uint64 *)((long)pDataSource + 0x10) = rangeEndInFrames;
      *(undefined8 *)((long)pDataSource + 0x18) = 0;
      *(undefined8 *)((long)pDataSource + 0x20) = 0xffffffffffffffff;
      if (uVar3 < rangeBegInFrames) {
        pcVar1 = *(code **)(*pDataSource + 8);
        rangeEndInFrames = rangeBegInFrames;
      }
      else {
        if (uVar3 <= rangeEndInFrames) {
          return MA_SUCCESS;
        }
        pcVar1 = *(code **)(*pDataSource + 8);
      }
      mVar4 = MA_SUCCESS;
      if (pcVar1 != (code *)0x0) {
        mVar4 = MA_SUCCESS;
        (*pcVar1)(pDataSource,rangeEndInFrames);
      }
    }
  }
  return mVar4;
}

Assistant:

MA_API ma_result ma_data_source_set_range_in_pcm_frames(ma_data_source* pDataSource, ma_uint64 rangeBegInFrames, ma_uint64 rangeEndInFrames)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;
    ma_result result;
    ma_uint64 relativeCursor;
    ma_uint64 absoluteCursor;
    ma_bool32 doSeekAdjustment = MA_FALSE;

    if (pDataSource == NULL) {
        return MA_INVALID_ARGS;
    }

    if (rangeEndInFrames < rangeBegInFrames) {
        return MA_INVALID_ARGS; /* The end of the range must come after the beginning. */
    }

    /*
    We may need to adjust the position of the cursor to ensure it's clamped to the range. Grab it now
    so we can calculate its absolute position before we change the range.
    */
    result = ma_data_source_get_cursor_in_pcm_frames(pDataSource, &relativeCursor);
    if (result == MA_SUCCESS) {
        doSeekAdjustment = MA_TRUE;
        absoluteCursor = relativeCursor + pDataSourceBase->rangeBegInFrames;
    } else {
        /*
        We couldn't get the position of the cursor. It probably means the data source has no notion
        of a cursor. We'll just leave it at position 0. Don't treat this as an error.
        */
        doSeekAdjustment = MA_FALSE;
        relativeCursor = 0;
        absoluteCursor = 0;
    }

    pDataSourceBase->rangeBegInFrames = rangeBegInFrames;
    pDataSourceBase->rangeEndInFrames = rangeEndInFrames;

    /*
    The commented out logic below was intended to maintain loop points in response to a change in the
    range. However, this is not useful because it results in the sound breaking when you move the range
    outside of the old loop points. I'm simplifying this by simply resetting the loop points. The
    caller is expected to update their loop points if they change the range.

    In practice this should be mostly a non-issue because the majority of the time the range will be
    set once right after initialization.
    */
    pDataSourceBase->loopBegInFrames = 0;
    pDataSourceBase->loopEndInFrames = ~((ma_uint64)0);


    /*
    Seek to within range. Note that our seek positions here are relative to the new range. We don't want
    to do this if we failed to retrieve the cursor earlier on because it probably means the data source
    has no notion of a cursor. In practice the seek would probably fail (which we silently ignore), but
    I'm just not even going to attempt it.
    */
    if (doSeekAdjustment) {
        if (absoluteCursor < rangeBegInFrames) {
            ma_data_source_seek_to_pcm_frame(pDataSource, 0);
        } else if (absoluteCursor > rangeEndInFrames) {
            ma_data_source_seek_to_pcm_frame(pDataSource, rangeEndInFrames - rangeBegInFrames);
        }
    }

    return MA_SUCCESS;
}